

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# srv_role.hxx
# Opt level: O2

string * __thiscall
nuraft::srv_role_to_string_abi_cxx11_(string *__return_storage_ptr__,nuraft *this,srv_role _role)

{
  allocator *paVar1;
  int iVar2;
  char *pcVar3;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  iVar2 = (int)this;
  if (iVar2 == 3) {
    pcVar3 = "leader";
    paVar1 = &local_b;
  }
  else if (iVar2 == 2) {
    pcVar3 = "candidate";
    paVar1 = &local_a;
  }
  else if (iVar2 == 1) {
    pcVar3 = "follower";
    paVar1 = &local_9;
  }
  else {
    pcVar3 = "UNKNOWN";
    paVar1 = &local_c;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,paVar1);
  return __return_storage_ptr__;
}

Assistant:

inline std::string ATTR_UNUSED
       srv_role_to_string(srv_role _role)
{
    switch (_role) {
    case follower:      return "follower";
    case candidate:     return "candidate";
    case leader:        return "leader";
    default:            return "UNKNOWN";
    }
    return "UNKNOWN";
}